

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::resize(Application *this)

{
  element_type *peVar1;
  element_type *peVar2;
  VkExtent2D VVar3;
  element_type *peVar4;
  uint32_t i;
  ulong uVar5;
  long lVar6;
  
  lVar6 = 0;
  uVar5 = 0;
  while( true ) {
    peVar1 = (this->m_frame_manager).
             super___shared_ptr<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2 = (peVar1->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar2->m_image_count <= uVar5) break;
    myvk::Framebuffer::Create
              ((Framebuffer *)&stack0xffffffffffffffc0,&this->m_render_pass,
               (Ptr<ImageView> *)
               ((long)&((peVar1->m_swapchain_image_views).
                        super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> + lVar6));
    std::__shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this->m_framebuffers).
                         super__Vector_base<std::shared_ptr<myvk::Framebuffer>,_std::allocator<std::shared_ptr<myvk::Framebuffer>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar6),(__shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2> *)
                      &stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x10;
  }
  VVar3 = (peVar2->m_swapchain_create_info).imageExtent;
  ((this->m_camera).super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_aspect_ratio =
       (float)((ulong)VVar3 & 0xffffffff) / (float)((ulong)VVar3 >> 0x20);
  peVar4 = (this->m_path_tracer_viewer).
           super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4->m_width = VVar3.width;
  peVar4->m_height = VVar3.height;
  OctreeTracer::Resize
            ((this->m_octree_tracer).super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,VVar3.width,VVar3.height);
  return;
}

Assistant:

void Application::resize() {
	for (uint32_t i = 0; i < m_frame_manager->GetSwapchain()->GetImageCount(); ++i) {
		m_framebuffers[i] = myvk::Framebuffer::Create(m_render_pass, m_frame_manager->GetSwapchainImageViews()[i]);
	}
	VkExtent2D extent = m_frame_manager->GetSwapchain()->GetExtent();
	m_camera->m_aspect_ratio = extent.width / float(extent.height);
	m_path_tracer_viewer->Resize(extent.width, extent.height);
	m_octree_tracer->Resize(extent.width, extent.height);
}